

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCNarrowPhaseCollider.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChNarrowPhaseCollider::ChNarrowPhaseCollider(ChNarrowPhaseCollider *this)

{
  pointer pCVar1;
  
  this->_vptr_ChNarrowPhaseCollider = (_func_int **)&PTR__ChNarrowPhaseCollider_00b6a398;
  (this->pairs).
  super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairs).
  super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->T).m_data[0] = 0.0;
  (this->T).m_data[1] = 0.0;
  (this->T).m_data[2] = 0.0;
  (this->T1).m_data[0] = 0.0;
  (this->T1).m_data[1] = 0.0;
  (this->T1).m_data[2] = 0.0;
  (this->T2).m_data[0] = 0.0;
  (this->T2).m_data[1] = 0.0;
  (this->T2).m_data[2] = 0.0;
  pCVar1 = (this->pairs).
           super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pairs).
      super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar1) {
    (this->pairs).
    super__Vector_base<chrono::collision::ChCollisionPair,_std::allocator<chrono::collision::ChCollisionPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar1;
  }
  this->num_collision_pairs = 0;
  this->num_bv_tests = 0;
  this->num_geo_tests = 0;
  return;
}

Assistant:

ChNarrowPhaseCollider::ChNarrowPhaseCollider() {
    // initially reserve a bit of space to contact array,
    // to avoid many reallocations if resizing needed for enlarging it.
    pairs.clear();
    num_collision_pairs = 0;
    num_bv_tests = 0;
    num_geo_tests = 0;
}